

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_history.c
# Opt level: O2

void fsg_history_entry_add
               (fsg_history_t *h,fsg_link_t *link,int32 frame,int32 score,int32 pred,int32 lc,
               fsg_pnode_ctxt_t rc)

{
  int iVar1;
  glist_t pgVar2;
  long lVar3;
  void *ptr;
  int iVar4;
  uint uVar5;
  gnode_s **ppgVar6;
  undefined8 *puVar7;
  gnode_t *pgVar8;
  glist_t pgVar9;
  gnode_t *pred_00;
  gnode_t *gn;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar10 [16];
  undefined1 auVar14 [16];
  
  if (frame < 0) {
    puVar7 = (undefined8 *)
             __ckd_calloc__(1,0x28,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                            ,0x92);
    *puVar7 = link;
    *(int32 *)(puVar7 + 2) = frame;
    *(int32 *)(puVar7 + 1) = score;
    *(int32 *)((long)puVar7 + 0xc) = pred;
    *(short *)((long)puVar7 + 0x14) = (short)lc;
    puVar7[3] = rc.bv._0_8_;
    puVar7[4] = rc.bv._8_8_;
    blkarray_list_append(h->entries,puVar7);
    return;
  }
  iVar1 = link->to_state;
  ppgVar6 = h->frame_entries[iVar1] + lc;
  pgVar8 = (gnode_t *)0x0;
  while ((pgVar2 = *ppgVar6, pgVar2 != (glist_t)0x0 &&
         (lVar3 = (pgVar2->data).i, score <= *(int *)(lVar3 + 8)))) {
    rc.bv[0] = ~*(uint *)(lVar3 + 0x18) & rc.bv[0];
    rc.bv[1] = ~*(uint *)(lVar3 + 0x1c) & rc.bv[1];
    rc.bv[2] = ~*(uint *)(lVar3 + 0x20) & rc.bv[2];
    rc.bv[3] = ~*(uint *)(lVar3 + 0x24) & rc.bv[3];
    auVar14._0_4_ = -(uint)(rc.bv[0] == 0);
    auVar14._4_4_ = -(uint)(rc.bv[1] == 0);
    auVar14._8_4_ = -(uint)(rc.bv[2] == 0);
    auVar14._12_4_ = -(uint)(rc.bv[3] == 0);
    iVar4 = movmskps((int)lVar3,auVar14);
    if (iVar4 == 0xf) {
      return;
    }
    ppgVar6 = &pgVar2->next;
    pgVar8 = pgVar2;
  }
  puVar7 = (undefined8 *)
           __ckd_calloc__(1,0x28,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                          ,0xb1);
  *puVar7 = link;
  *(int32 *)(puVar7 + 2) = frame;
  *(int32 *)(puVar7 + 1) = score;
  *(int32 *)((long)puVar7 + 0xc) = pred;
  *(short *)((long)puVar7 + 0x14) = (short)lc;
  puVar7[3] = CONCAT44(rc.bv[1],rc.bv[0]);
  puVar7[4] = CONCAT44(rc.bv[3],rc.bv[2]);
  if (pgVar8 == (gnode_t *)0x0) {
    pgVar9 = glist_add_ptr(h->frame_entries[iVar1][lc],puVar7);
    h->frame_entries[iVar1][lc] = pgVar9;
    pgVar8 = (gnode_t *)h->frame_entries[iVar1];
    pred_00 = (gnode_t *)(&pgVar8->data)[lc].ptr;
  }
  else {
    pgVar8 = glist_insert_ptr(pgVar8,puVar7);
    pred_00 = pgVar8;
  }
  while (gn = pgVar2, gn != (gnode_t *)0x0) {
    ptr = (gn->data).ptr;
    uVar5 = ~rc.bv[0] & *(uint *)((long)ptr + 0x18);
    uVar11 = ~rc.bv[1] & *(uint *)((long)ptr + 0x1c);
    uVar12 = ~rc.bv[2] & *(uint *)((long)ptr + 0x20);
    uVar13 = ~rc.bv[3] & *(uint *)((long)ptr + 0x24);
    *(uint *)((long)ptr + 0x18) = uVar5;
    *(uint *)((long)ptr + 0x1c) = uVar11;
    *(uint *)((long)ptr + 0x20) = uVar12;
    *(uint *)((long)ptr + 0x24) = uVar13;
    auVar10._0_4_ = -(uint)(uVar5 == 0);
    auVar10._4_4_ = -(uint)(uVar11 == 0);
    auVar10._8_4_ = -(uint)(uVar12 == 0);
    auVar10._12_4_ = -(uint)(uVar13 == 0);
    uVar5 = movmskps((int)pgVar8,auVar10);
    pgVar8 = (gnode_t *)(ulong)(uVar5 ^ 0xf);
    if ((uVar5 ^ 0xf) == 0) {
      ckd_free(ptr);
      pgVar8 = gnode_free(gn,pred_00);
      pgVar2 = pgVar8;
    }
    else {
      pgVar2 = gn->next;
      pred_00 = gn;
    }
  }
  return;
}

Assistant:

void
fsg_history_entry_add(fsg_history_t * h,
                      fsg_link_t * link,
                      int32 frame, int32 score, int32 pred,
                      int32 lc, fsg_pnode_ctxt_t rc)
{
    fsg_hist_entry_t *entry, *new_entry;
    int32 s;
    gnode_t *gn, *prev_gn;

    /* Skip the optimization for the initial dummy entries; always enter them */
    if (frame < 0) {
        new_entry =
            (fsg_hist_entry_t *) ckd_calloc(1, sizeof(fsg_hist_entry_t));
        new_entry->fsglink = link;
        new_entry->frame = frame;
        new_entry->score = score;
        new_entry->pred = pred;
        new_entry->lc = lc;
        new_entry->rc = rc;

        blkarray_list_append(h->entries, (void *) new_entry);
        return;
    }

    s = fsg_link_to_state(link);

    /* Locate where this entry should be inserted in frame_entries[s][lc] */
    prev_gn = NULL;
    for (gn = h->frame_entries[s][lc]; gn; gn = gnode_next(gn)) {
        entry = (fsg_hist_entry_t *) gnode_ptr(gn);

        if (score BETTER_THAN entry->score)
            break;              /* Found where to insert new entry */

        /* Existing entry score not worse than new score */
        if (FSG_PNODE_CTXT_SUB(&rc, &(entry->rc)) == 0)
            return;             /* rc set reduced to 0; new entry can be ignored */

        prev_gn = gn;
    }

    /* Create new entry after prev_gn (if prev_gn is NULL, at head) */
    new_entry =
        (fsg_hist_entry_t *) ckd_calloc(1, sizeof(fsg_hist_entry_t));
    new_entry->fsglink = link;
    new_entry->frame = frame;
    new_entry->score = score;
    new_entry->pred = pred;
    new_entry->lc = lc;
    new_entry->rc = rc;         /* Note: rc set must be non-empty at this point */

    if (!prev_gn) {
        h->frame_entries[s][lc] = glist_add_ptr(h->frame_entries[s][lc],
                                                (void *) new_entry);
        prev_gn = h->frame_entries[s][lc];
    }
    else
        prev_gn = glist_insert_ptr(prev_gn, (void *) new_entry);

    /*
     * Update the rc set of all the remaining entries in the list.  At this
     * point, gn is the entry, if any, immediately following new entry.
     */
    while (gn) {
        entry = (fsg_hist_entry_t *) gnode_ptr(gn);

        if (FSG_PNODE_CTXT_SUB(&(entry->rc), &rc) == 0) {
            /* rc set of entry reduced to 0; can prune this entry */
            ckd_free((void *) entry);
            gn = gnode_free(gn, prev_gn);
        }
        else {
            prev_gn = gn;
            gn = gnode_next(gn);
        }
    }
}